

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tests.c
# Opt level: O0

void damage_array(uchar *sig,size_t *len)

{
  byte bVar1;
  int iVar2;
  uint32_t uVar3;
  uint32_t uVar4;
  uint64_t uVar5;
  ulong *in_RSI;
  long in_RDI;
  int action;
  int pos;
  int in_stack_ffffffffffffffcc;
  undefined8 in_stack_ffffffffffffffd0;
  
  uVar3 = (uint32_t)((ulong)in_stack_ffffffffffffffd0 >> 0x20);
  uVar5 = testrand_bits(in_stack_ffffffffffffffcc);
  iVar2 = (int)uVar5;
  if ((iVar2 < 1) && (3 < *in_RSI)) {
    uVar3 = testrand_int(uVar3);
    memmove((void *)(in_RDI + (int)uVar3),(void *)(in_RDI + (int)uVar3 + 1),
            (*in_RSI - (long)(int)uVar3) - 1);
    *in_RSI = *in_RSI - 1;
  }
  else if ((iVar2 < 2) && (*in_RSI < 0x800)) {
    uVar3 = testrand_int(uVar3);
    memmove((void *)(in_RDI + (int)uVar3 + 1),(void *)(in_RDI + (int)uVar3),
            *in_RSI - (long)(int)uVar3);
    uVar5 = testrand_bits(in_stack_ffffffffffffffcc);
    *(char *)(in_RDI + (int)uVar3) = (char)uVar5;
    *in_RSI = *in_RSI + 1;
  }
  else if (iVar2 < 4) {
    uVar4 = testrand_int(uVar3);
    uVar3 = testrand_int(uVar3);
    *(char *)(in_RDI + (ulong)uVar3) = *(char *)(in_RDI + (ulong)uVar3) + (char)uVar4 + '\x01';
  }
  else {
    uVar5 = testrand_bits(in_stack_ffffffffffffffcc);
    bVar1 = (byte)(1 << ((byte)uVar5 & 0x1f));
    uVar3 = testrand_int((uint32_t)((ulong)in_RDI >> 0x20));
    *(byte *)(in_RDI + (ulong)uVar3) = *(byte *)(in_RDI + (ulong)uVar3) ^ bVar1;
  }
  return;
}

Assistant:

static void damage_array(unsigned char *sig, size_t *len) {
    int pos;
    int action = testrand_bits(3);
    if (action < 1 && *len > 3) {
        /* Delete a byte. */
        pos = testrand_int(*len);
        memmove(sig + pos, sig + pos + 1, *len - pos - 1);
        (*len)--;
        return;
    } else if (action < 2 && *len < 2048) {
        /* Insert a byte. */
        pos = testrand_int(1 + *len);
        memmove(sig + pos + 1, sig + pos, *len - pos);
        sig[pos] = testrand_bits(8);
        (*len)++;
        return;
    } else if (action < 4) {
        /* Modify a byte. */
        sig[testrand_int(*len)] += 1 + testrand_int(255);
        return;
    } else { /* action < 8 */
        /* Modify a bit. */
        sig[testrand_int(*len)] ^= 1 << testrand_bits(3);
        return;
    }
}